

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O3

BP5WriterRec __thiscall
adios2::format::BP5Serializer::CreateWriterRec
          (BP5Serializer *this,void *Variable,char *Name,DataType Type,size_t ElemSize,
          size_t DimCount)

{
  pointer *ppp_Var1;
  iterator __position;
  DataType DVar2;
  int iVar3;
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_false,_true>
  _Var4;
  size_t sVar5;
  FMFieldList p_Var6;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  size_t sVar10;
  _FMFormatBody *p_Var11;
  BP5Serializer *pBVar12;
  BP5Serializer *pBVar13;
  undefined4 in_register_0000000c;
  long lVar14;
  uint ElementSize;
  int *piVar15;
  undefined8 *puVar16;
  FMStructDescRec *pFVar17;
  BP5Serializer *pBVar18;
  bool bVar19;
  byte bVar20;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_false,_true>,_bool>
  pVar21;
  char *local_118;
  int IDLength;
  size_t local_f0;
  BP5Serializer *local_e8;
  void *local_e0;
  FMStructDescRec struct_list [4];
  FMFormat Format;
  _FMFormatBody local_40 [16];
  
  bVar20 = 0;
  struct_list[0].format_name = (char *)&struct_list[0].struct_size;
  std::__cxx11::string::_M_construct<char*>
            ((string *)struct_list,*(long *)((long)Variable + 8),
             *(long *)((long)Variable + 0x10) + *(long *)((long)Variable + 8));
  struct_list[2].format_name = (char *)0x0;
  struct_list[2].field_list = (FMFieldList)0x0;
  struct_list[1].struct_size = 0;
  struct_list[1]._20_4_ = 0;
  struct_list[1].opt_info = (FMOptInfo *)0x0;
  struct_list[1].format_name = (char *)0x0;
  struct_list[1].field_list = (FMFieldList)0x0;
  struct_list[2].struct_size = 0;
  struct_list[2]._20_4_ = 0;
  pVar21 = std::
           _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::format::BP5Serializer::_BP5WriterRec>,std::allocator<std::pair<std::__cxx11::string_const,adios2::format::BP5Serializer::_BP5WriterRec>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
           ::
           _M_emplace<std::pair<std::__cxx11::string,adios2::format::BP5Serializer::_BP5WriterRec>>
                     ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::format::BP5Serializer::_BP5WriterRec>,std::allocator<std::pair<std::__cxx11::string_const,adios2::format::BP5Serializer::_BP5WriterRec>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                       *)&(this->Info).RecNameMap,struct_list);
  _Var4 = pVar21.first.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_true>
          ._M_cur;
  pBVar13 = (BP5Serializer *)struct_list[0].format_name;
  if ((int *)struct_list[0].format_name != &struct_list[0].struct_size) {
    operator_delete(struct_list[0].format_name);
  }
  if (Type == String) {
    ElemSize = 8;
  }
  *(void **)((long)_Var4.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_true>
                   ._M_cur + 0x28) = Variable;
  *(undefined4 *)
   ((long)_Var4.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_true>
          ._M_cur + 0x34) = *(undefined4 *)((long)Variable + 0x40);
  *(int *)((long)_Var4.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_true>
                 ._M_cur + 0x30) = (this->Info).RecCount;
  *(int *)((long)_Var4.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_true>
                 ._M_cur + 0x50) = (int)DimCount;
  *(DataType *)
   ((long)_Var4.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_true>
          ._M_cur + 0x54) = Type;
  *(undefined8 *)
   ((long)_Var4.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_true>
          ._M_cur + 0x48) = 0;
  local_e0 = Variable;
  if (Type == Struct) {
    pBVar13 = *(BP5Serializer **)((long)Variable + 0x248);
    if (pBVar13 == (BP5Serializer *)0x0) {
      pBVar13 = *(BP5Serializer **)((long)Variable + 0x240);
    }
    local_f0 = ElemSize;
    local_e8 = this;
    sVar5 = core::StructDefinition::Fields((StructDefinition *)pBVar13);
    p_Var6 = (FMFieldList)malloc(sVar5 * 0x18 + 0x18);
    sVar5 = core::StructDefinition::Fields((StructDefinition *)pBVar13);
    if (sVar5 != 0) {
      piVar15 = &p_Var6->field_offset;
      sVar5 = 0;
      do {
        core::StructDefinition::Name_abi_cxx11_
                  ((string *)struct_list,(StructDefinition *)pBVar13,sVar5);
        pcVar8 = struct_list[0].format_name;
        pcVar7 = strdup(struct_list[0].format_name);
        ((_FMField *)(piVar15 + -5))->field_name = pcVar7;
        if ((int *)pcVar8 != &struct_list[0].struct_size) {
          operator_delete(pcVar8);
        }
        pBVar12 = pBVar13;
        DVar2 = core::StructDefinition::Type((StructDefinition *)pBVar13,sVar5);
        pcVar8 = TranslateADIOS2Type2FFS(pBVar12,DVar2);
        *(char **)(piVar15 + -3) = pcVar8;
        DVar2 = core::StructDefinition::Type((StructDefinition *)pBVar13,sVar5);
        iVar3 = TypeElementSize(DVar2);
        piVar15[-1] = iVar3;
        sVar9 = core::StructDefinition::Offset((StructDefinition *)pBVar13,sVar5);
        *piVar15 = (int)sVar9;
        sVar9 = core::StructDefinition::ElementCount((StructDefinition *)pBVar13,sVar5);
        if (sVar9 != 1) {
          pcVar8 = *(char **)(piVar15 + -3);
          sVar10 = strlen(pcVar8);
          pcVar7 = (char *)malloc(sVar10 + 10);
          core::StructDefinition::ElementCount((StructDefinition *)pBVar13,sVar5);
          snprintf(pcVar7,sVar10 + 10,"%s[%d]",pcVar8);
          free(*(char **)(piVar15 + -3));
          *(char **)(piVar15 + -3) = pcVar7;
        }
        sVar5 = sVar5 + 1;
        sVar9 = core::StructDefinition::Fields((StructDefinition *)pBVar13);
        piVar15 = piVar15 + 6;
      } while (sVar5 < sVar9);
    }
    sVar5 = core::StructDefinition::Fields((StructDefinition *)pBVar13);
    p_Var6[sVar5].field_name = (char *)0x0;
    p_Var6[sVar5].field_type = (char *)0x0;
    p_Var6[sVar5].field_size = 0;
    p_Var6[sVar5].field_offset = 0;
    puVar16 = &DAT_008731b0;
    pFVar17 = struct_list;
    for (lVar14 = 0x10; lVar14 != 0; lVar14 = lVar14 + -1) {
      pFVar17->format_name = (char *)*puVar16;
      puVar16 = puVar16 + (ulong)bVar20 * -2 + 1;
      pFVar17 = (FMStructDescRec *)((long)pFVar17 + (ulong)bVar20 * -0x10 + 8);
    }
    core::StructDefinition::StructName_abi_cxx11_((string *)&Format,(StructDefinition *)pBVar13);
    struct_list[0].format_name = strdup((char *)Format);
    if (Format != local_40) {
      operator_delete(Format);
    }
    struct_list[0].field_list = p_Var6;
    sVar5 = core::StructDefinition::StructSize((StructDefinition *)pBVar13);
    struct_list[0].struct_size = (int)sVar5;
    p_Var11 = (_FMFormatBody *)register_data_format((local_e8->Info).LocalFMContext,struct_list);
    Format = p_Var11;
    free_FMfield_list(p_Var6);
    free(struct_list[0].format_name);
    get_server_ID_FMformat(p_Var11,&IDLength);
    lVar14 = (long)IDLength;
    pBVar13 = (BP5Serializer *)(lVar14 * 2 + 1);
    pBVar12 = (BP5Serializer *)malloc((size_t)pBVar13);
    if (0 < lVar14) {
      lVar14 = 0;
      pBVar18 = pBVar12;
      do {
        pBVar13 = pBVar18;
        snprintf((char *)pBVar18,3,"%02x");
        lVar14 = lVar14 + 1;
        pBVar18 = (BP5Serializer *)((long)&pBVar18->_vptr_BP5Serializer + 2);
      } while (lVar14 < IDLength);
    }
    Variable = local_e0;
    this = local_e8;
    __position._M_current =
         (local_e8->NewStructFormats).
         super__Vector_base<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (local_e8->NewStructFormats).
        super__Vector_base<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      pBVar13 = (BP5Serializer *)&local_e8->NewStructFormats;
      std::vector<_FMFormatBody*,std::allocator<_FMFormatBody*>>::
      _M_realloc_insert<_FMFormatBody*const&>
                ((vector<_FMFormatBody*,std::allocator<_FMFormatBody*>> *)pBVar13,__position,&Format
                );
      ElemSize = local_f0;
    }
    else {
      *__position._M_current = p_Var11;
      ppp_Var1 = &(local_e8->NewStructFormats).
                  super__Vector_base<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *ppp_Var1 = *ppp_Var1 + 1;
      ElemSize = local_f0;
    }
  }
  else {
    pBVar12 = (BP5Serializer *)0x0;
  }
  if (DimCount == 0) {
    pcVar8 = BuildVarName(pBVar13,Name,*(ShapeID *)((long)Variable + 0x40),0,0);
    AddField(pBVar13,&(this->Info).MetaFields,&(this->Info).MetaFieldCount,pcVar8,Type,(int)ElemSize
            );
    free(pcVar8);
    RecalcMarshalStorageSize(this);
    *(long *)((long)_Var4.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_true>
                    ._M_cur + 0x40) =
         (long)(this->Info).MetaFields[(long)(this->Info).MetaFieldCount + -1].field_offset;
    *(undefined8 *)
     ((long)_Var4.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_true>
            ._M_cur + 0x38) = 0xffffffffffffffff;
  }
  else {
    if (*(long **)((long)Variable + 0xe0) == *(long **)((long)Variable + 0xd8)) {
      local_118 = (char *)0x0;
    }
    else {
      local_118 = strdup(*(char **)(**(long **)((long)Variable + 0xd8) + 8));
    }
    if ((ulong)*(uint *)((long)Variable + 0x40) < 6) {
      pcVar8 = (&PTR_anon_var_dwarf_13738a2_00873230)[*(uint *)((long)Variable + 0x40)];
    }
    else {
      pcVar8 = "BP5";
    }
    if (pBVar12 == (BP5Serializer *)0x0) {
      lVar14 = 0x16;
    }
    else {
      sVar10 = strlen((char *)pBVar12);
      lVar14 = sVar10 + 0x16;
    }
    sVar10 = strlen(Name);
    pBVar13 = (BP5Serializer *)malloc(sVar10 + lVar14);
    if (pBVar12 == (BP5Serializer *)0x0) {
      pcVar7 = "%s%s%zd_%d";
    }
    else {
      pcVar7 = "%s%s%zd_%d_%s";
    }
    snprintf((char *)pBVar13,sVar10 + lVar14,pcVar7,pcVar8,"_",ElemSize,
             CONCAT44(in_register_0000000c,Type));
    sVar10 = strlen((char *)pBVar13);
    pcVar8 = (char *)((long)&pBVar13->_vptr_BP5Serializer + sVar10);
    pcVar8[0] = '_';
    pcVar8[1] = '\0';
    pBVar18 = pBVar13;
    strcat((char *)pBVar13,Name);
    bVar19 = *(long *)((long)local_e0 + 0xe0) != *(long *)((long)local_e0 + 0xd8);
    pcVar8 = "MetaArrayOp";
    if (!bVar19) {
      pcVar8 = "MetaArray";
    }
    iVar3 = (uint)bVar19 * 8;
    ElementSize = iVar3 + 0x38;
    if (0 < this->m_StatsLevel) {
      pBVar18 = (BP5Serializer *)struct_list;
      struct_list[0].struct_size = 0;
      struct_list[0]._20_4_ = 0;
      struct_list[0].opt_info = (FMOptInfo *)0x0;
      struct_list[0].format_name = (char *)0x0;
      struct_list[0].field_list = (FMFieldList)0x0;
      struct_list[1].format_name = (char *)0x0;
      strcat((char *)pBVar18,pcVar8);
      switch(ElemSize) {
      case 1:
        pBVar18 = (BP5Serializer *)struct_list;
        sVar10 = strlen((char *)pBVar18);
        *(undefined4 *)((long)&struct_list[0].format_name + sVar10) = 0x314d4d;
        break;
      case 2:
        pBVar18 = (BP5Serializer *)struct_list;
        sVar10 = strlen((char *)pBVar18);
        *(undefined4 *)((long)&struct_list[0].format_name + sVar10) = 0x324d4d;
        break;
      case 3:
      case 5:
      case 6:
      case 7:
        break;
      case 4:
        pBVar18 = (BP5Serializer *)struct_list;
        sVar10 = strlen((char *)pBVar18);
        *(undefined4 *)((long)&struct_list[0].format_name + sVar10) = 0x344d4d;
        break;
      case 8:
        pBVar18 = (BP5Serializer *)struct_list;
        sVar10 = strlen((char *)pBVar18);
        *(undefined4 *)((long)&struct_list[0].format_name + sVar10) = 0x384d4d;
        break;
      default:
        if (ElemSize == 0x10) {
          pBVar18 = (BP5Serializer *)struct_list;
          sVar10 = strlen((char *)pBVar18);
          *(undefined4 *)((long)&struct_list[0].format_name + sVar10) = 0x36314d4d;
          *(undefined1 *)((long)&struct_list[0].format_name + sVar10 + 4) = 0;
        }
      }
      *(ulong *)((long)_Var4.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_true>
                       ._M_cur + 0x58) = (ulong)ElementSize;
      ElementSize = iVar3 + 0x40;
      pcVar8 = (char *)struct_list;
    }
    AddSimpleField(pBVar18,&(this->Info).MetaFields,&(this->Info).MetaFieldCount,(char *)pBVar13,
                   pcVar8,ElementSize);
    *(long *)((long)_Var4.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_true>
                    ._M_cur + 0x40) =
         (long)(this->Info).MetaFields[(long)(this->Info).MetaFieldCount + -1].field_offset;
    *(char **)((long)_Var4.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_true>
                     ._M_cur + 0x48) = local_118;
    free(pBVar13);
    RecalcMarshalStorageSize(this);
  }
  (this->Info).MetaFormat = (FMFormat)0x0;
  if (pBVar12 != (BP5Serializer *)0x0) {
    free(pBVar12);
  }
  (this->Info).RecCount = (this->Info).RecCount + 1;
  return (BP5WriterRec)
         ((long)_Var4.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_true>
                ._M_cur + 0x28);
}

Assistant:

BP5Serializer::BP5WriterRec BP5Serializer::CreateWriterRec(void *Variable, const char *Name,
                                                           DataType Type, size_t ElemSize,
                                                           size_t DimCount)
{
    core::VariableBase *VB = static_cast<core::VariableBase *>(Variable);
#ifdef ADIOS2_HAVE_DERIVED_VARIABLE
    core::VariableDerived *VD = dynamic_cast<core::VariableDerived *>(VB);
#endif
    auto obj = Info.RecNameMap.insert(std::make_pair(VB->m_Name, _BP5WriterRec()));
    BP5WriterRec Rec = &obj.first->second;
    if (Type == DataType::String)
        ElemSize = sizeof(char *);
    Rec->Key = Variable;
    Rec->Shape = VB->m_ShapeID;
    Rec->FieldID = Info.RecCount;
    Rec->DimCount = (int)DimCount;
    Rec->Type = (int)Type;
    Rec->OperatorType = NULL;
    char *TextStructID = NULL;
    if (Type == DataType::Struct)
    {
        core::VariableStruct *VS = static_cast<core::VariableStruct *>(Variable);
        core::StructDefinition *SD = VS->m_WriteStructDefinition;
        if (VS->m_ReadStructDefinition)
            SD = VS->m_ReadStructDefinition; // Data has been converted to this
        FMField *List = (FMField *)malloc((SD->Fields() + 1) * sizeof(List[0]));
        for (size_t i = 0; i < SD->Fields(); i++)
        {
            List[i].field_name = strdup(SD->Name(i).c_str());
            List[i].field_type = TranslateADIOS2Type2FFS(SD->Type(i));
            List[i].field_size = TypeElementSize(SD->Type(i));
            List[i].field_offset = (int)SD->Offset(i);
            if (SD->ElementCount(i) != 1)
            {
                size_t Len = strlen(List[i].field_type) + 10;
                char *Tmp = (char *)malloc(Len);
                snprintf(Tmp, Len, "%s[%d]", List[i].field_type, (int)SD->ElementCount(i));
                free((void *)List[i].field_type);
                List[i].field_type = Tmp;
            }
        }
        List[SD->Fields()] = {NULL, NULL, 0, 0};

        FMStructDescRec struct_list[4] = {
            {NULL, NULL, 0, NULL},
            {"complex4", fcomplex_field_list, sizeof(fcomplex_struct), NULL},
            {"complex8", dcomplex_field_list, sizeof(dcomplex_struct), NULL},
            {NULL, NULL, 0, NULL}};
        struct_list[0].format_name = strdup(SD->StructName().c_str());
        struct_list[0].field_list = List;
        struct_list[0].struct_size = (int)SD->StructSize();

        FMFormat Format = register_data_format(Info.LocalFMContext, &struct_list[0]);
        free_FMfield_list(List);
        free((void *)struct_list[0].format_name);

        int IDLength;
        char *ServerID = get_server_ID_FMformat(Format, &IDLength);
        TextStructID = (char *)malloc(IDLength * 2 + 1);
        for (int i = 0; i < IDLength; i++)
        {
            snprintf(&TextStructID[i * 2], 3, "%02x", ((unsigned char *)ServerID)[i]);
        }
        NewStructFormats.push_back(Format);
    }
    if (DimCount == 0)
    {
        // simple field, only add base value FMField to metadata
        char *SstName = BuildVarName(Name, VB->m_ShapeID, 0,
                                     0); // size and type in full field spec
        AddField(&Info.MetaFields, &Info.MetaFieldCount, SstName, Type, (int)ElemSize);
        free(SstName);
        RecalcMarshalStorageSize();
        Rec->MetaOffset = Info.MetaFields[Info.MetaFieldCount - 1].field_offset;
        Rec->DataOffset = (size_t)-1;
        // Changing the formats renders these invalid
        Info.MetaFormat = NULL;
    }
    else
    {
        char *OperatorType = NULL;
        if (VB->m_Operations.size())
        {
            OperatorType = strdup((VB->m_Operations[0])->m_TypeString.data());
        }
        // Array field.  To Metadata, add FMFields for DimCount, Shape, Count
        // and Offsets matching _MetaArrayRec
        const char *ExprString = NULL;
        bool NeverMinMax = false;
#ifdef ADIOS2_HAVE_DERIVED_VARIABLE
        if (VD && (VD->GetDerivedType() != DerivedVarType::StoreData))
            ExprString = VD->m_Expr.ExprString.c_str();
        if (VD && (VD->GetDerivedType() == DerivedVarType::ExpressionString))
            NeverMinMax = true;
#endif
        char *LongName =
            BuildLongName(Name, VB->m_ShapeID, (int)Type, ElemSize, TextStructID, ExprString);

        const char *ArrayTypeName = "MetaArray";
        int FieldSize = sizeof(MetaArrayRec);
        if (VB->m_Operations.size())
        {
            ArrayTypeName = "MetaArrayOp";
            FieldSize = sizeof(MetaArrayRecOperator);
        }
        if ((m_StatsLevel > 0) && !NeverMinMax)
        {
            char MMArrayName[40] = {0};
            strcat(MMArrayName, ArrayTypeName);
            switch (ElemSize)
            {
            case 1:
                strcat(MMArrayName, "MM1");
                break;
            case 2:
                strcat(MMArrayName, "MM2");
                break;
            case 4:
                strcat(MMArrayName, "MM4");
                break;
            case 8:
                strcat(MMArrayName, "MM8");
                break;
            case 16:
                strcat(MMArrayName, "MM16");
                break;
            }
            Rec->MinMaxOffset = FieldSize;
            FieldSize += sizeof(char *);
            AddSimpleField(&Info.MetaFields, &Info.MetaFieldCount, LongName, MMArrayName,
                           FieldSize);
        }
        else
        {
            AddSimpleField(&Info.MetaFields, &Info.MetaFieldCount, LongName, ArrayTypeName,
                           FieldSize);
        }
        Rec->MetaOffset = Info.MetaFields[Info.MetaFieldCount - 1].field_offset;
        Rec->OperatorType = OperatorType;
        free(LongName);
        RecalcMarshalStorageSize();

        // Changing the formats renders these invalid
        Info.MetaFormat = NULL;
    }
    if (TextStructID)
        free((void *)TextStructID);
    Info.RecCount++;
    return Rec;
}